

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int MMDB_open(char *filename,uint32_t flags,MMDB_s *mmdb)

{
  uint16_t *puVar1;
  uint64_t *key;
  long lVar2;
  long *plVar3;
  char *pcVar4;
  _Bool _Var5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  char *pcVar12;
  int *piVar13;
  uint8_t *puVar14;
  uint16_t uVar15;
  long lVar16;
  char **value;
  uint64_t *value_00;
  long *plVar17;
  long *plVar18;
  char *pcVar19;
  uint32_t uVar20;
  char *pcVar21;
  MMDB_entry_data_s entry_data;
  MMDB_s metadata_db;
  MMDB_entry_s local_118;
  char *local_108;
  undefined8 local_100;
  MMDB_entry_data_s local_f8;
  undefined1 local_c0 [40];
  uint32_t local_98;
  uint8_t *local_90;
  
  (mmdb->metadata).description.count = 0;
  mmdb->file_content = (uint8_t *)0x0;
  mmdb->data_section = (uint8_t *)0x0;
  (mmdb->metadata).database_type = (char *)0x0;
  (mmdb->metadata).languages.count = 0;
  (mmdb->metadata).languages.names = (char **)0x0;
  sVar11 = strlen(filename);
  pcVar12 = (char *)malloc(sVar11 + 1);
  pcVar19 = (char *)0x0;
  if (pcVar12 != (char *)0x0) {
    memcpy(pcVar12,filename,sVar11 + 1);
    pcVar19 = pcVar12;
  }
  mmdb->filename = pcVar19;
  if (pcVar19 == (char *)0x0) {
    uVar9 = 5;
  }
  else {
    mmdb->flags = (flags & 7) == 0 | flags;
    iVar7 = open(pcVar19,0x80000);
    uVar9 = 1;
    if ((-1 < iVar7) && (iVar8 = fstat(iVar7,(stat *)local_c0), iVar8 == 0)) {
      if ((long)local_90 < 0) {
        uVar9 = 5;
      }
      else {
        uVar9 = 0;
        puVar14 = (uint8_t *)mmap((void *)0x0,(size_t)local_90,1,1,iVar7,0);
        if (puVar14 == (uint8_t *)0xffffffffffffffff) {
          piVar13 = __errno_location();
          uVar9 = *piVar13 == 0xc | 4;
        }
        else {
          mmdb->file_size = (ssize_t)local_90;
          mmdb->file_content = puVar14;
        }
      }
    }
    piVar13 = __errno_location();
    iVar8 = *piVar13;
    if (-1 < iVar7) {
      close(iVar7);
    }
    *piVar13 = iVar8;
    if (uVar9 == 0) {
      pcVar19 = (char *)mmdb->file_size;
      if ((long)pcVar19 < 0) {
        uVar20 = 0;
        plVar18 = (long *)0x0;
      }
      else {
        pcVar12 = (char *)0x20000;
        if ((long)pcVar19 < 0x20000) {
          pcVar12 = pcVar19;
        }
        plVar3 = (long *)(mmdb->file_content + ((long)pcVar19 - (long)pcVar12));
        pcVar4 = pcVar12;
        do {
          pcVar21 = pcVar4;
          plVar18 = plVar3;
          if ((char *)0xd < pcVar21) {
            for (plVar17 = plVar18; plVar17 <= (long *)((long)plVar18 + (long)(pcVar21 + -0xe));
                plVar17 = (long *)((long)plVar17 + 1)) {
              if (((char)*plVar17 == -0x55) &&
                 (*(long *)((long)plVar17 + 6) == 0x6d6f632e646e694d &&
                  *plVar17 == 0x694d78614defcdab)) goto LAB_00101c00;
            }
          }
          plVar17 = (long *)0x0;
LAB_00101c00:
          plVar3 = (long *)((long)plVar17 + 0xe);
          pcVar4 = (char *)((long)plVar18 + (long)(pcVar21 + (-0xe - (long)plVar17)));
        } while (plVar17 != (long *)0x0);
        uVar20 = (uint32_t)pcVar21;
        if (plVar18 == (long *)(mmdb->file_content + ((long)pcVar19 - (long)pcVar12))) {
          uVar20 = 0;
          plVar18 = (long *)0x0;
        }
      }
      if (plVar18 != (long *)0x0) {
        mmdb->metadata_section = (uint8_t *)plVar18;
        mmdb->metadata_section_size = uVar20;
        memset((MMDB_s *)local_c0,0,0x88);
        local_118.offset = 0;
        local_108 = "node_count";
        local_100 = 0;
        local_118.mmdb = (MMDB_s *)local_c0;
        local_c0._32_8_ = plVar18;
        local_98 = uVar20;
        uVar9 = MMDB_aget_value(&local_118,&local_f8,&local_108);
        if ((uVar9 == 0) && (uVar9 = 3, local_f8.type == 6)) {
          (mmdb->metadata).node_count = local_f8.field_1.pointer;
          uVar9 = 0;
        }
        if ((uVar9 == 0) && (uVar10 = 3, uVar9 = uVar10, (mmdb->metadata).node_count != 0)) {
          puVar1 = &(mmdb->metadata).record_size;
          uVar9 = value_for_key_as_uint16(&local_118,"record_size",puVar1);
          if (uVar9 == 0) {
            uVar6 = *puVar1;
            uVar6 = uVar6 << 0xe | uVar6 >> 2;
            if (uVar6 - 6 < 3) {
              puVar1 = &(mmdb->metadata).ip_version;
              uVar9 = value_for_key_as_uint16(&local_118,"ip_version",puVar1);
              if ((((uVar9 == 0) && (uVar9 = uVar10, (*puVar1 | 2) == 6)) &&
                  (uVar9 = value_for_key_as_string
                                     (&local_118,(char *)&(mmdb->metadata).database_type,value),
                  uVar9 == 0)) &&
                 (uVar9 = populate_languages_metadata(mmdb,(MMDB_s *)local_c0,&local_118),
                 uVar9 == 0)) {
                puVar1 = &(mmdb->metadata).binary_format_major_version;
                uVar9 = value_for_key_as_uint16(&local_118,"binary_format_major_version",puVar1);
                if (((uVar9 == 0) && (uVar9 = uVar10, *puVar1 != 0)) &&
                   (uVar9 = value_for_key_as_uint16
                                      (&local_118,"binary_format_minor_version",
                                       &(mmdb->metadata).binary_format_minor_version), uVar9 == 0))
                {
                  key = &(mmdb->metadata).build_epoch;
                  uVar9 = value_for_key_as_uint64(&local_118,(char *)key,value_00);
                  if (((uVar9 == 0) && (uVar9 = uVar10, *key != 0)) &&
                     (uVar9 = populate_description_metadata(mmdb,(MMDB_s *)local_c0,&local_118),
                     uVar9 == 0)) {
                    mmdb->full_record_byte_size = (mmdb->metadata).record_size >> 2;
                    uVar15 = 0x80;
                    if ((mmdb->metadata).ip_version == 4) {
                      uVar15 = 0x20;
                    }
                    mmdb->depth = uVar15;
                    uVar9 = 0;
                  }
                }
              }
            }
            else {
              uVar9 = uVar10;
              if (uVar6 != 0) {
                uVar9 = 6;
              }
            }
          }
        }
        if ((uVar9 != 0) || (uVar9 = 6, (mmdb->metadata).binary_format_major_version != 2))
        goto LAB_00101d98;
        _Var5 = can_multiply(0x7fffffffffffffff,(ulong)(mmdb->metadata).node_count,
                             (ulong)mmdb->full_record_byte_size);
        if (_Var5) {
          lVar16 = (ulong)mmdb->full_record_byte_size * (ulong)(mmdb->metadata).node_count;
          lVar2 = mmdb->file_size;
          mmdb->data_section = mmdb->file_content + lVar16 + 0x10;
          if ((lVar16 - (lVar2 + -0x10) == 0 || lVar16 < lVar2 + -0x10) && 0xf < lVar2) {
            uVar9 = 3;
            if (0xffffffff00000000 < (lVar2 - lVar16) - 0x100000010U) {
              uVar10 = (int)(lVar2 - lVar16) - 0x10;
              mmdb->data_section_size = uVar10;
              uVar9 = 7;
              if (2 < uVar10) {
                mmdb->metadata_section = (uint8_t *)plVar18;
                (mmdb->ipv4_start_node).node_value = 0;
                (mmdb->ipv4_start_node).netmask = 0;
                uVar9 = 0;
                if ((mmdb->metadata).ip_version == 6) {
                  uVar9 = find_ipv4_start_node(mmdb);
                }
              }
            }
            goto LAB_00101d98;
          }
        }
      }
      uVar9 = 3;
    }
  }
LAB_00101d98:
  if (uVar9 != 0) {
    piVar13 = __errno_location();
    iVar7 = *piVar13;
    free_mmdb_struct(mmdb);
    *piVar13 = iVar7;
  }
  return uVar9;
}

Assistant:

int MMDB_open(const char *const filename, uint32_t flags, MMDB_s *const mmdb) {
    int status = MMDB_SUCCESS;

    mmdb->file_content = NULL;
    mmdb->data_section = NULL;
    mmdb->metadata.database_type = NULL;
    mmdb->metadata.languages.count = 0;
    mmdb->metadata.languages.names = NULL;
    mmdb->metadata.description.count = 0;

    mmdb->filename = mmdb_strdup(filename);
    if (NULL == mmdb->filename) {
        status = MMDB_OUT_OF_MEMORY_ERROR;
        goto cleanup;
    }

    if ((flags & MMDB_MODE_MASK) == 0) {
        flags |= MMDB_MODE_MMAP;
    }
    mmdb->flags = flags;

    if (MMDB_SUCCESS != (status = map_file(mmdb))) {
        goto cleanup;
    }

#ifdef _WIN32
    WSADATA wsa;
    WSAStartup(MAKEWORD(2, 2), &wsa);
#endif

    uint32_t metadata_size = 0;
    const uint8_t *metadata =
        find_metadata(mmdb->file_content, mmdb->file_size, &metadata_size);
    if (NULL == metadata) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->metadata_section_size = metadata_size;

    status = read_metadata(mmdb);
    if (MMDB_SUCCESS != status) {
        goto cleanup;
    }

    if (mmdb->metadata.binary_format_major_version != 2) {
        status = MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
        goto cleanup;
    }

    if (!can_multiply(SSIZE_MAX,
                      mmdb->metadata.node_count,
                      mmdb->full_record_byte_size)) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t search_tree_size = (ssize_t)mmdb->metadata.node_count *
                               (ssize_t)mmdb->full_record_byte_size;

    mmdb->data_section =
        mmdb->file_content + search_tree_size + MMDB_DATA_SECTION_SEPARATOR;
    if (mmdb->file_size < MMDB_DATA_SECTION_SEPARATOR ||
        search_tree_size > mmdb->file_size - MMDB_DATA_SECTION_SEPARATOR) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t data_section_size =
        mmdb->file_size - search_tree_size - MMDB_DATA_SECTION_SEPARATOR;
    if (data_section_size > UINT32_MAX || data_section_size <= 0) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    mmdb->data_section_size = (uint32_t)data_section_size;

    // Although it is likely not possible to construct a database with valid
    // valid metadata, as parsed above, and a data_section_size less than 3,
    // we do this check as later we assume it is at least three when doing
    // bound checks.
    if (mmdb->data_section_size < 3) {
        status = MMDB_INVALID_DATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->ipv4_start_node.node_value = 0;
    mmdb->ipv4_start_node.netmask = 0;

    // We do this immediately as otherwise there is a race to set
    // ipv4_start_node.node_value and ipv4_start_node.netmask.
    if (mmdb->metadata.ip_version == 6) {
        status = find_ipv4_start_node(mmdb);
        if (status != MMDB_SUCCESS) {
            goto cleanup;
        }
    }

cleanup:
    if (MMDB_SUCCESS != status) {
        int saved_errno = errno;
        free_mmdb_struct(mmdb);
        errno = saved_errno;
    }
    return status;
}